

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsData.cpp
# Opt level: O0

int32_t helicsDataBufferFillFromTime(HelicsDataBuffer data,HelicsTime value)

{
  size_t sVar1;
  bad_alloc *anon_var_0;
  SmallBuffer *ptr;
  SmallBuffer *in_stack_ffffffffffffffa8;
  TimeRepresentation<count_time<9,_long>_> *this;
  HelicsDataBuffer in_stack_ffffffffffffffb8;
  TimeRepresentation<count_time<9,_long>_> local_30;
  baseType local_28;
  SmallBuffer *local_20;
  int32_t local_4;
  
  local_20 = getBuffer(in_stack_ffffffffffffffb8);
  if (local_20 == (SmallBuffer *)0x0) {
    local_4 = 0;
  }
  else {
    this = &local_30;
    TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
              (this,(double)in_stack_ffffffffffffffa8);
    local_28 = TimeRepresentation<count_time<9,_long>_>::getBaseTimeCode(this);
    helics::ValueConverter<long>::convert(&this->internalTimeCode,in_stack_ffffffffffffffa8);
    sVar1 = helics::SmallBuffer::size(local_20);
    local_4 = (int32_t)sVar1;
  }
  return local_4;
}

Assistant:

int32_t helicsDataBufferFillFromTime(HelicsDataBuffer data, HelicsTime value)
{
    auto* ptr = getBuffer(data);
    if (ptr == nullptr) {
        return 0;
    }
    try {
        helics::ValueConverter<int64_t>::convert(helics::Time(value).getBaseTimeCode(), *ptr);
        return static_cast<int32_t>(ptr->size());
    }
    catch (const std::bad_alloc&) {
        return 0;
    }
}